

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O1

SQObject __thiscall SQFuncState::CreateTable(SQFuncState *this)

{
  SQUnsignedInteger *pSVar1;
  SQSharedState *ss;
  SQObjectType SVar2;
  SQObjectValue SVar3;
  SQObject SVar4;
  SQObjectPtr nt;
  SQObjectPtr local_38;
  SQObjectPtr local_28;
  
  ss = this->_sharedstate;
  SVar3.pUserPointer = sq_vm_malloc(0x58);
  SQTable::SQTable(SVar3.pTable,ss,0);
  ((SVar3.pTable)->super_SQDelegable)._delegate = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_TABLE;
  pSVar1 = &((SVar3.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
  *pSVar1 = *pSVar1 + 1;
  local_38.super_SQObject._type = OT_INTEGER;
  local_38.super_SQObject._unVal.nInteger = 1;
  local_28.super_SQObject._unVal.pUserPointer = SVar3.pUserPointer;
  SQTable::NewSlot((this->_strings).super_SQObject._unVal.pTable,&local_28,&local_38);
  SQObjectPtr::~SQObjectPtr(&local_38);
  SVar3 = local_28.super_SQObject._unVal;
  SVar2 = local_28.super_SQObject._type;
  SQObjectPtr::~SQObjectPtr(&local_28);
  SVar4._4_4_ = 0;
  SVar4._type = SVar2;
  SVar4._unVal.pTable = SVar3.pTable;
  return SVar4;
}

Assistant:

SQObject SQFuncState::CreateTable()
{
    SQObjectPtr nt(SQTable::Create(_sharedstate,0));
    _table(_strings)->NewSlot(nt,(SQInteger)1);
    return nt;
}